

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

bool __thiscall
Clasp::Asp::LogicProgram::extractCore(LogicProgram *this,LitVec *solverCore,LitVec *prgLits)

{
  pointer pVVar1;
  uint uVar2;
  int iVar3;
  pointer pLVar4;
  SharedContext *pSVar5;
  pointer puVar6;
  PrgAtom *pPVar7;
  Id_t IVar8;
  uint uVar9;
  Literal LVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  AtomList *vec;
  Id_t *x;
  ulong uVar16;
  int local_4c;
  long local_48;
  AtomList *local_40;
  LitVec *local_38;
  
  (prgLits->ebo_).size = 0;
  uVar9 = (solverCore->ebo_).size;
  uVar16 = (ulong)uVar9;
  if (uVar16 == 0) {
    lVar11 = 0;
  }
  else {
    pLVar4 = (solverCore->ebo_).buf;
    pSVar5 = (this->super_ProgramBuilder).ctx_;
    uVar2 = (pSVar5->varInfo_).ebo_.size;
    lVar13 = uVar16 << 2;
    lVar11 = 0;
    do {
      uVar15 = pLVar4[lVar11].rep_;
      uVar14 = uVar15 >> 2;
      if (uVar2 <= uVar14) break;
      pVVar1 = (pSVar5->varInfo_).ebo_.buf + uVar14;
      pVVar1->rep = pVVar1->rep | 2U - ((uVar15 & 2) == 0);
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + -4;
    } while (lVar13 != 0);
  }
  local_38 = solverCore;
  if ((uint)lVar11 == uVar9) {
    uVar12 = (ulong)(this->frozen_).ebo_.size;
    if (uVar9 != 0 && uVar12 != 0) {
      puVar6 = (this->frozen_).ebo_.buf;
      vec = &this->atoms_;
      lVar11 = uVar12 * 4 + -4;
      lVar13 = 0;
      local_48 = lVar11;
      local_40 = vec;
      do {
        IVar8 = getEqNode<bk_lib::pod_vector<Clasp::Asp::PrgAtom*,std::allocator<Clasp::Asp::PrgAtom*>>const>
                          (this,vec,*(Id_t *)((long)puVar6 + lVar13));
        pPVar7 = (this->atoms_).ebo_.buf[IVar8];
        uVar9 = *(uint *)&(pPVar7->super_PrgHead).field_0x18;
        if ((uVar9 >> 0x1e & 1) != 0) {
          uVar15 = *(int *)&(pPVar7->super_PrgHead).super_PrgNode * 2;
          uVar9 = uVar9 & 0x60000000;
          uVar2 = (uint)(uVar9 == 0x60000000) * 2;
          if (uVar15 != uVar2) {
            lVar11 = local_48;
            if ((2U - ((uVar15 & 2) == uVar2) &
                (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[uVar15 >> 2].rep) != 0) {
              iVar3 = *(int *)((long)puVar6 + lVar13);
              local_4c = -iVar3;
              if (uVar9 != 0x60000000) {
                local_4c = iVar3;
              }
              bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,&local_4c);
              pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (uVar15 >> 2);
              pVVar1->rep = pVVar1->rep & ((uVar15 & 2) == uVar2) - 3U;
              uVar16 = (ulong)((int)uVar16 - 1);
              vec = local_40;
              lVar11 = local_48;
            }
          }
        }
      } while ((lVar11 != lVar13) && (lVar13 = lVar13 + 4, (int)uVar16 != 0));
    }
    uVar12 = (ulong)(this->assume_).ebo_.size;
    if ((int)uVar16 != 0 && uVar12 != 0) {
      x = (Id_t *)(this->assume_).ebo_.buf;
      lVar11 = uVar12 * 4;
      do {
        lVar11 = lVar11 + -4;
        LVar10 = getLiteral(this,*x,(MapLit_t)0x0);
        if ((2U - ((LVar10.rep_ & 2) == 0) &
            (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[LVar10.rep_ >> 2].rep) != 0) {
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,(int *)x);
          pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (LVar10.rep_ >> 2);
          pVVar1->rep = pVVar1->rep & ((LVar10.rep_ & 2) == 0) - 3U;
          uVar16 = (ulong)((int)uVar16 - 1);
        }
      } while ((lVar11 != 0) && (x = x + 1, (int)uVar16 != 0));
    }
  }
  uVar9 = (local_38->ebo_).size;
  if ((ulong)uVar9 != 0) {
    pLVar4 = (local_38->ebo_).buf;
    pSVar5 = (this->super_ProgramBuilder).ctx_;
    uVar2 = (pSVar5->varInfo_).ebo_.size;
    lVar11 = 0;
    do {
      uVar15 = *(uint *)((long)&pLVar4->rep_ + lVar11) >> 2;
      if (uVar15 < uVar2) {
        pVVar1 = (pSVar5->varInfo_).ebo_.buf + uVar15;
        pVVar1->rep = pVVar1->rep & 0xfc;
      }
      lVar11 = lVar11 + 4;
    } while ((ulong)uVar9 * 4 - lVar11 != 0);
  }
  return (prgLits->ebo_).size == uVar9;
}

Assistant:

bool LogicProgram::extractCore(const LitVec& solverCore, Potassco::LitVec& prgLits) const 	{
	uint32 marked = 0;
	prgLits.clear();
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (!ctx()->validVar(it->var())) { break; }
		ctx()->mark(*it);
		++marked;
	}
	if (marked == solverCore.size()) {
		for (VarVec::const_iterator it = frozen_.begin(), end = frozen_.end(); it != end && marked; ++it) {
			PrgAtom* atom = getRootAtom(*it);
			Literal lit = atom->assumption();
			if (lit == lit_true() || !ctx()->marked(lit)) continue;
			prgLits.push_back(atom->literal() == lit ? Potassco::lit(*it) : Potassco::neg(*it));
			ctx()->unmark(lit);
			--marked;
		}
		for (Potassco::LitVec::const_iterator it = assume_.begin(), end = assume_.end(); it != end && marked; ++it) {
			Literal lit = getLiteral(Potassco::id(*it));
			if (!ctx()->marked(lit)) continue;
			prgLits.push_back(*it);
			ctx()->unmark(lit);
			--marked;
		}
	}
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (ctx()->validVar(it->var()))
			ctx()->unmark(it->var());
	}
	return prgLits.size() == solverCore.size();
}